

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url-test.c++
# Opt level: O3

Url * kj::anon_unknown_0::parseAndCheck
                (Url *__return_storage_ptr__,StringPtr originalText,StringPtr expectedRestringified,
                Options options)

{
  int iVar1;
  int iVar2;
  Url *extraout_RAX;
  void *__child_stack;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  size_t sVar3;
  char *__s1;
  char *pcVar4;
  undefined6 in_register_0000008a;
  char *ptrCopy;
  bool bVar5;
  StringPtr url;
  StringPtr expectedRestringified_local;
  StringPtr originalText_local;
  String local_128;
  Url clone;
  
  expectedRestringified_local.content.size_ = expectedRestringified.content.size_;
  url.content.ptr = originalText.content.size_;
  originalText_local.content.ptr = originalText.content.ptr;
  expectedRestringified_local.content.ptr = expectedRestringified.content.ptr;
  if (expectedRestringified_local.content.size_ < 2) {
    expectedRestringified_local.content.ptr = originalText_local.content.ptr;
    expectedRestringified_local.content.size_ = url.content.ptr;
  }
  iVar2 = 0;
  pcVar4 = (char *)(CONCAT62(in_register_0000008a,options) & 0xffffffff);
  url.content.size_ = 0;
  originalText_local.content.size_ = url.content.ptr;
  Url::parse(__return_storage_ptr__,(Url *)originalText_local.content.ptr,url,
             (Context)CONCAT62(in_register_0000008a,options),options);
  Url::toString(&clone.scheme,__return_storage_ptr__,REMOTE_HREF);
  __child_stack = (void *)(clone.scheme.content.size_ + (clone.scheme.content.size_ == 0));
  bVar5 = true;
  if (__child_stack == (void *)expectedRestringified_local.content.size_) {
    __s1 = "";
    if (clone.scheme.content.size_ != 0) {
      __s1 = clone.scheme.content.ptr;
    }
    iVar1 = bcmp(__s1,expectedRestringified_local.content.ptr,(long)__child_stack - 1);
    bVar5 = iVar1 != 0;
    __child_stack = extraout_RDX;
  }
  if (clone.scheme.content.ptr != (char *)0x0) {
    pcVar4 = (char *)clone.scheme.content.size_;
    (**(clone.scheme.content.disposer)->_vptr_ArrayDisposer)
              (clone.scheme.content.disposer,clone.scheme.content.ptr,1,clone.scheme.content.size_,
               clone.scheme.content.size_,0);
    iVar2 = (int)clone.scheme.content.size_;
    __child_stack = extraout_RDX_00;
  }
  if ((bool)(bVar5 & _::Debug::minSeverity < 3)) {
    iVar2 = 0x3812da;
    pcVar4 = "failed: expected kj::str(url) == expectedRestringified";
    _::Debug::log<char_const(&)[55],kj::Url&,kj::StringPtr&,kj::StringPtr&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x21,ERROR,
               "\"failed: expected \" \"kj::str(url) == expectedRestringified\", url, originalText, expectedRestringified"
               ,(char (*) [55])"failed: expected kj::str(url) == expectedRestringified",
               __return_storage_ptr__,&originalText_local,&expectedRestringified_local);
    __child_stack = extraout_RDX_01;
  }
  Url::clone(&clone,(__fn *)__return_storage_ptr__,__child_stack,iVar2,pcVar4);
  Url::toString(&local_128,&clone,REMOTE_HREF);
  sVar3 = local_128.content.size_ + (local_128.content.size_ == 0);
  bVar5 = true;
  if (sVar3 == expectedRestringified_local.content.size_) {
    pcVar4 = "";
    if (local_128.content.size_ != 0) {
      pcVar4 = local_128.content.ptr;
    }
    iVar2 = bcmp(pcVar4,expectedRestringified_local.content.ptr,sVar3 - 1);
    bVar5 = iVar2 != 0;
  }
  if (local_128.content.ptr != (char *)0x0) {
    (**(local_128.content.disposer)->_vptr_ArrayDisposer)
              (local_128.content.disposer,local_128.content.ptr,1,local_128.content.size_,
               local_128.content.size_,0);
  }
  if ((bool)(bVar5 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[57],kj::Url&,kj::StringPtr&,kj::StringPtr&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x24,ERROR,
               "\"failed: expected \" \"kj::str(clone) == expectedRestringified\", clone, originalText, expectedRestringified"
               ,(char (*) [57])"failed: expected kj::str(clone) == expectedRestringified",&clone,
               &originalText_local,&expectedRestringified_local);
  }
  Url::~Url(&clone);
  return extraout_RAX;
}

Assistant:

Url parseAndCheck(kj::StringPtr originalText, kj::StringPtr expectedRestringified = nullptr,
                  Url::Options options = {}) {
  if (expectedRestringified == nullptr) expectedRestringified = originalText;
  auto url = Url::parse(originalText, Url::REMOTE_HREF, options);
  KJ_EXPECT(kj::str(url) == expectedRestringified, url, originalText, expectedRestringified);
  // Make sure clones also restringify to the expected string.
  auto clone = url.clone();
  KJ_EXPECT(kj::str(clone) == expectedRestringified, clone, originalText, expectedRestringified);
  return url;
}